

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall dxil_spv::SPIRVModule::Impl::build_demote_call_cond(Impl *this,Id cond)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Id IVar1;
  Function *pFVar2;
  Block *pBVar3;
  size_t sVar4;
  allocator_type local_bd;
  Id local_bc;
  iterator local_b8;
  undefined8 local_b0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_a8;
  undefined4 local_8c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  Block *local_80;
  Block *false_block;
  Block *true_block;
  allocator_type local_55;
  Id local_54;
  iterator local_50;
  undefined8 local_48;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_40;
  Block *local_28;
  Block *entry;
  Block *current_build_point;
  Impl *pIStack_10;
  Id cond_local;
  Impl *this_local;
  
  current_build_point._4_4_ = cond;
  pIStack_10 = this;
  entry = spv::Builder::getBuildPoint(&this->builder);
  if (this->demote_function_cond == (Function *)0x0) {
    local_28 = (Block *)0x0;
    IVar1 = spv::Builder::makeVoidType(&this->builder);
    local_54 = spv::Builder::makeBoolType(&this->builder);
    local_50 = &local_54;
    local_48 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = local_50;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_40,__l_00,&local_55);
    memset(&true_block,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&true_block);
    sVar4 = 0x7fffffff;
    pFVar2 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,IVar1,"demote_cond",&local_40,
                        (Vector<dxil_spv::Vector<Decoration>_> *)&true_block,&local_28);
    this->demote_function_cond = pFVar2;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&true_block);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_40);
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar4 = (size_t)IVar1;
    spv::Block::Block(pBVar3,IVar1,this->demote_function_cond);
    false_block = pBVar3;
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar3,IVar1,this->demote_function_cond);
    local_80 = pBVar3;
    spv::Builder::setBuildPoint(&this->builder,local_28);
    spv::Builder::createSelectionMerge(&this->builder,local_80,0);
    IVar1 = spv::Function::getParamId(this->demote_function_cond,0);
    spv::Builder::createConditionalBranch(&this->builder,IVar1,false_block,local_80);
    pBVar3 = false_block;
    local_8c = 0x1504;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_88);
    add_instruction(this,pBVar3,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    spv::Builder::setBuildPoint(&this->builder,false_block);
    spv::Builder::createBranch(&this->builder,local_80);
    spv::Builder::setBuildPoint(&this->builder,local_80);
    spv::Builder::makeReturn(&this->builder,false,0);
  }
  spv::Builder::setBuildPoint(&this->builder,entry);
  pFVar2 = this->demote_function_cond;
  local_bc = current_build_point._4_4_;
  local_b8 = &local_bc;
  local_b0 = 1;
  __l._M_len = 1;
  __l._M_array = local_b8;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            (&local_a8,__l,&local_bd);
  spv::Builder::createFunctionCall(&this->builder,pFVar2,&local_a8);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_a8);
  return;
}

Assistant:

void SPIRVModule::Impl::build_demote_call_cond(spv::Id cond)
{
	auto *current_build_point = builder.getBuildPoint();

	if (!demote_function_cond)
	{
		spv::Block *entry = nullptr;
		demote_function_cond =
			builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), "demote_cond",
		                              { builder.makeBoolType() }, {}, &entry);

		auto *true_block = new spv::Block(builder.getUniqueId(), *demote_function_cond);
		auto *false_block = new spv::Block(builder.getUniqueId(), *demote_function_cond);
		builder.setBuildPoint(entry);
		builder.createSelectionMerge(false_block, 0);
		builder.createConditionalBranch(demote_function_cond->getParamId(0), true_block, false_block);
		add_instruction(true_block, std::make_unique<spv::Instruction>(spv::OpDemoteToHelperInvocationEXT));
		builder.setBuildPoint(true_block);
		builder.createBranch(false_block);
		builder.setBuildPoint(false_block);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	builder.createFunctionCall(demote_function_cond, { cond });
}